

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::swap(CImg<unsigned_int> *this,CImg<unsigned_int> *img)

{
  CImg<unsigned_int> *img_local;
  CImg<unsigned_int> *this_local;
  
  cimg::swap<unsigned_int>(&this->_width,&img->_width);
  cimg::swap<unsigned_int>(&this->_height,&img->_height);
  cimg::swap<unsigned_int>(&this->_depth,&img->_depth);
  cimg::swap<unsigned_int>(&this->_spectrum,&img->_spectrum);
  cimg::swap<unsigned_int*>(&this->_data,&img->_data);
  cimg::swap<bool>(&this->_is_shared,&img->_is_shared);
  return img;
}

Assistant:

CImg<T>& swap(CImg<T>& img) {
      cimg::swap(_width,img._width);
      cimg::swap(_height,img._height);
      cimg::swap(_depth,img._depth);
      cimg::swap(_spectrum,img._spectrum);
      cimg::swap(_data,img._data);
      cimg::swap(_is_shared,img._is_shared);
      return img;
    }